

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListDup(sqlite3 *db,SrcList *p,int flags)

{
  int iVar1;
  Table *pTVar2;
  int *piVar3;
  SrcItem *pSVar4;
  char *pcVar5;
  ExprList *pEVar6;
  Select *pSVar7;
  IdList *pIVar8;
  Expr *pEVar9;
  int local_58;
  Table *pTab;
  SrcItem *pOldItem;
  SrcItem *pNewItem;
  int nByte;
  int i;
  SrcList *pNew;
  int flags_local;
  SrcList *p_local;
  sqlite3 *db_local;
  
  if (p == (SrcList *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    if (p->nSrc < 1) {
      local_58 = 0;
    }
    else {
      local_58 = (p->nSrc + -1) * 0x68;
    }
    db_local = (sqlite3 *)sqlite3DbMallocRawNN(db,(long)(local_58 + 0x70));
    if (db_local == (sqlite3 *)0x0) {
      db_local = (sqlite3 *)0x0;
    }
    else {
      iVar1 = p->nSrc;
      *(int *)((long)&db_local->pVfs + 4) = iVar1;
      *(int *)&db_local->pVfs = iVar1;
      for (pNewItem._4_4_ = 0; pNewItem._4_4_ < p->nSrc; pNewItem._4_4_ = pNewItem._4_4_ + 1) {
        piVar3 = db_local->aLimit + (long)pNewItem._4_4_ * 0x1a + -0x20;
        pSVar4 = p->a + pNewItem._4_4_;
        *(Schema **)piVar3 = pSVar4->pSchema;
        pcVar5 = sqlite3DbStrDup(db,pSVar4->zDatabase);
        *(char **)(piVar3 + 2) = pcVar5;
        pcVar5 = sqlite3DbStrDup(db,pSVar4->zName);
        *(char **)(piVar3 + 4) = pcVar5;
        pcVar5 = sqlite3DbStrDup(db,pSVar4->zAlias);
        *(char **)(piVar3 + 6) = pcVar5;
        piVar3[0xf] = (int)pSVar4->fg;
        piVar3[0x10] = pSVar4->iCursor;
        piVar3[0xc] = pSVar4->addrFillSub;
        piVar3[0xd] = pSVar4->regReturn;
        if ((*(ushort *)((long)piVar3 + 0x3d) >> 1 & 1) != 0) {
          pcVar5 = sqlite3DbStrDup(db,(pSVar4->u1).zIndexedBy);
          *(char **)(piVar3 + 0x16) = pcVar5;
        }
        *(anon_union_8_2_e349d845_for_u2 *)(piVar3 + 0x18) = pSVar4->u2;
        if ((*(ushort *)((long)piVar3 + 0x3d) >> 8 & 1) != 0) {
          *(int *)*(void ***)(piVar3 + 0x18) = *(int *)*(void ***)(piVar3 + 0x18) + 1;
        }
        if ((*(ushort *)((long)piVar3 + 0x3d) >> 2 & 1) != 0) {
          pEVar6 = sqlite3ExprListDup(db,(pSVar4->u1).pFuncArg,flags);
          *(ExprList **)(piVar3 + 0x16) = pEVar6;
        }
        pTVar2 = pSVar4->pTab;
        *(Table **)(piVar3 + 8) = pTVar2;
        if (pTVar2 != (Table *)0x0) {
          pTVar2->nTabRef = pTVar2->nTabRef + 1;
        }
        pSVar7 = sqlite3SelectDup(db,pSVar4->pSelect,flags);
        *(Select **)(piVar3 + 10) = pSVar7;
        if ((*(ushort *)&(pSVar4->fg).field_0x1 >> 10 & 1) == 0) {
          pEVar9 = sqlite3ExprDup(db,(pSVar4->u3).pOn,flags);
          *(Expr **)(piVar3 + 0x12) = pEVar9;
        }
        else {
          pIVar8 = sqlite3IdListDup(db,(pSVar4->u3).pUsing);
          *(IdList **)(piVar3 + 0x12) = pIVar8;
        }
        *(Bitmask *)(piVar3 + 0x14) = pSVar4->colUsed;
      }
    }
  }
  return (SrcList *)db_local;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListDup(sqlite3 *db, const SrcList *p, int flags){
  SrcList *pNew;
  int i;
  int nByte;
  assert( db!=0 );
  if( p==0 ) return 0;
  nByte = sizeof(*p) + (p->nSrc>0 ? sizeof(p->a[0]) * (p->nSrc-1) : 0);
  pNew = sqlite3DbMallocRawNN(db, nByte );
  if( pNew==0 ) return 0;
  pNew->nSrc = pNew->nAlloc = p->nSrc;
  for(i=0; i<p->nSrc; i++){
    SrcItem *pNewItem = &pNew->a[i];
    const SrcItem *pOldItem = &p->a[i];
    Table *pTab;
    pNewItem->pSchema = pOldItem->pSchema;
    pNewItem->zDatabase = sqlite3DbStrDup(db, pOldItem->zDatabase);
    pNewItem->zName = sqlite3DbStrDup(db, pOldItem->zName);
    pNewItem->zAlias = sqlite3DbStrDup(db, pOldItem->zAlias);
    pNewItem->fg = pOldItem->fg;
    pNewItem->iCursor = pOldItem->iCursor;
    pNewItem->addrFillSub = pOldItem->addrFillSub;
    pNewItem->regReturn = pOldItem->regReturn;
    if( pNewItem->fg.isIndexedBy ){
      pNewItem->u1.zIndexedBy = sqlite3DbStrDup(db, pOldItem->u1.zIndexedBy);
    }
    pNewItem->u2 = pOldItem->u2;
    if( pNewItem->fg.isCte ){
      pNewItem->u2.pCteUse->nUse++;
    }
    if( pNewItem->fg.isTabFunc ){
      pNewItem->u1.pFuncArg =
          sqlite3ExprListDup(db, pOldItem->u1.pFuncArg, flags);
    }
    pTab = pNewItem->pTab = pOldItem->pTab;
    if( pTab ){
      pTab->nTabRef++;
    }
    pNewItem->pSelect = sqlite3SelectDup(db, pOldItem->pSelect, flags);
    if( pOldItem->fg.isUsing ){
      assert( pNewItem->fg.isUsing );
      pNewItem->u3.pUsing = sqlite3IdListDup(db, pOldItem->u3.pUsing);
    }else{
      pNewItem->u3.pOn = sqlite3ExprDup(db, pOldItem->u3.pOn, flags);
    }
    pNewItem->colUsed = pOldItem->colUsed;
  }
  return pNew;
}